

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::TracingServiceState::TracingServiceState(TracingServiceState *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TracingServiceState_003a11f8
  ;
  this->num_sessions_ = 0;
  this->num_sessions_started_ = 0;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tracing_sessions_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tracing_sessions_).
  super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->tracing_service_version_)._M_dataplus._M_p =
       (pointer)&(this->tracing_service_version_).field_2;
  (this->tracing_service_version_)._M_string_length = 0;
  (this->tracing_service_version_).field_2._M_local_buf[0] = '\0';
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

TracingServiceState::TracingServiceState() = default;